

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_printer.cc
# Opt level: O3

void __thiscall LinePrinter::Print(LinePrinter *this,string *to_print,LineType type)

{
  byte bVar1;
  int iVar2;
  winsize size;
  undefined1 auStack_48 [2];
  ushort local_46;
  string local_40;
  
  if (this->console_locked_ == true) {
    std::__cxx11::string::_M_assign((string *)&this->line_buffer_);
    this->line_type_ = type;
  }
  else {
    bVar1 = this->smart_terminal_;
    if ((bool)bVar1 == true) {
      putchar(0xd);
      bVar1 = this->smart_terminal_;
    }
    if ((type != ELIDE) || ((bVar1 & 1) == 0)) {
      puts((to_print->_M_dataplus)._M_p);
      return;
    }
    iVar2 = ioctl(1,0x5413,auStack_48);
    if (local_46 != 0 && iVar2 == 0) {
      ElideMiddle(&local_40,to_print,(ulong)local_46);
      std::__cxx11::string::operator=((string *)to_print,(string *)&local_40);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
    }
    printf("%s",(to_print->_M_dataplus)._M_p);
    printf("\x1b[K");
    fflush(_stdout);
    this->have_blank_line_ = false;
  }
  return;
}

Assistant:

void LinePrinter::Print(string to_print, LineType type) {
  if (console_locked_) {
    line_buffer_ = to_print;
    line_type_ = type;
    return;
  }

  if (smart_terminal_) {
    printf("\r");  // Print over previous line, if any.
    // On Windows, calling a C library function writing to stdout also handles
    // pausing the executable when the "Pause" key or Ctrl-S is pressed.
  }

  if (smart_terminal_ && type == ELIDE) {
#ifdef _WIN32
    CONSOLE_SCREEN_BUFFER_INFO csbi;
    GetConsoleScreenBufferInfo(console_, &csbi);

    to_print = ElideMiddle(to_print, static_cast<size_t>(csbi.dwSize.X));
    // We don't want to have the cursor spamming back and forth, so instead of
    // printf use WriteConsoleOutput which updates the contents of the buffer,
    // but doesn't move the cursor position.
    COORD buf_size = { csbi.dwSize.X, 1 };
    COORD zero_zero = { 0, 0 };
    SMALL_RECT target = {
      csbi.dwCursorPosition.X, csbi.dwCursorPosition.Y,
      static_cast<SHORT>(csbi.dwCursorPosition.X + csbi.dwSize.X - 1),
      csbi.dwCursorPosition.Y
    };
    vector<CHAR_INFO> char_data(csbi.dwSize.X);
    for (size_t i = 0; i < static_cast<size_t>(csbi.dwSize.X); ++i) {
      char_data[i].Char.AsciiChar = i < to_print.size() ? to_print[i] : ' ';
      char_data[i].Attributes = csbi.wAttributes;
    }
    WriteConsoleOutput(console_, &char_data[0], buf_size, zero_zero, &target);
#else
    // Limit output to width of the terminal if provided so we don't cause
    // line-wrapping.
    winsize size;
    if ((ioctl(STDOUT_FILENO, TIOCGWINSZ, &size) == 0) && size.ws_col) {
      to_print = ElideMiddle(to_print, size.ws_col);
    }
    printf("%s", to_print.c_str());
    printf("\x1B[K");  // Clear to end of line.
    fflush(stdout);
#endif

    have_blank_line_ = false;
  } else {
    printf("%s\n", to_print.c_str());
  }
}